

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall Server::unload_module(Server *this,string *module)

{
  undefined8 uVar1;
  iterator __position;
  code *pcVar2;
  ostream *poVar3;
  
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
               ::find(&(this->loaded_modules)._M_t,module);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->loaded_modules)._M_t._M_impl.super__Rb_tree_header) {
    uVar1 = *(undefined8 *)(__position._M_node + 2);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
    ::_M_erase_aux(&(this->loaded_modules)._M_t,(const_iterator)__position._M_node);
    pcVar2 = (code *)dlsym(uVar1,"module_unload");
    (*pcVar2)(this);
    dlclose(uVar1);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Module ",7);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(module->_M_dataplus)._M_p,module->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," is not loaded!\n",0x10);
  return;
}

Assistant:

void Server::unload_module(std::string module) {
    auto m = this->loaded_modules.find(module);
    if (m != this->loaded_modules.end()) {
        auto handle = std::get<1>(*m);
        this->loaded_modules.erase(m);
        auto module_unload = (ModuleUnload) dlsym(handle, "module_unload");
        module_unload(this);
        dlclose(handle);
    } else {
        std::cout << "Module " << module << " is not loaded!\n";
    }
}